

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeSIMDExtract
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,SIMDExtractOp op,uint8_t lane)

{
  SIMDExtract *pSVar1;
  bool bVar2;
  Ok local_ad;
  uint local_ac;
  Err local_a8;
  Err *local_78;
  Err *err;
  Result<wasm::Ok> _val;
  SIMDExtract curr;
  uint8_t lane_local;
  SIMDExtractOp op_local;
  IRBuilder *this_local;
  
  pSVar1 = (SIMDExtract *)
           ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                   super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                   super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                   super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
  SIMDExtract::SIMDExtract(pSVar1);
  UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_>::visitSIMDExtract
            ((Result<wasm::Ok> *)&err,
             (UnifiedExpressionVisitor<wasm::IRBuilder,_wasm::Result<wasm::Ok>_> *)this,pSVar1);
  local_78 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err);
  bVar2 = local_78 != (Err *)0x0;
  if (bVar2) {
    wasm::Err::Err(&local_a8,local_78);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_a8);
    wasm::Err::~Err(&local_a8);
  }
  local_ac = (uint)bVar2;
  Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err);
  if (local_ac == 0) {
    pSVar1 = Builder::makeSIMDExtract(&this->builder,op,(Expression *)curr._16_8_,lane);
    push(this,(Expression *)pSVar1);
    Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_ad);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<> IRBuilder::makeSIMDExtract(SIMDExtractOp op, uint8_t lane) {
  SIMDExtract curr;
  CHECK_ERR(visitSIMDExtract(&curr));
  push(builder.makeSIMDExtract(op, curr.vec, lane));
  return Ok{};
}